

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemmodel_p.h
# Opt level: O2

CheckState QtPrivate::legacyEnumValueFromModelData<Qt::CheckState>(QVariant *data)

{
  int iVar1;
  int iVar2;
  CheckState CVar3;
  
  iVar1 = ::QVariant::typeId(data);
  iVar2 = qMetaTypeId<Qt::CheckState>();
  if (iVar1 == iVar2) {
    CVar3 = qvariant_cast<Qt::CheckState>(data);
    return CVar3;
  }
  CVar3 = ::QVariant::toInt((bool *)data);
  return CVar3;
}

Assistant:

T legacyEnumValueFromModelData(const QVariant &data)
{
    static_assert(std::is_enum_v<T>);
    if (data.userType() == qMetaTypeId<T>()) {
        return data.value<T>();
    } else if (std::is_same_v<std::underlying_type_t<T>, int> ||
               std::is_same_v<std::underlying_type_t<T>, uint>) {
        return T(data.toInt());
    }

    return T();
}